

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_downscaleStats(uint *table,U32 lastEltIndex,U32 shift,base_directive_e base1)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  uint newStat;
  uint base;
  U32 sum;
  U32 s;
  uint local_28;
  U32 local_1c;
  uint local_18;
  
  local_1c = 0;
  if (in_EDX < 0x1e) {
    for (local_18 = 0; local_18 < in_ESI + 1U; local_18 = local_18 + 1) {
      if (in_ECX == 0) {
        local_28 = (uint)(*(int *)(in_RDI + (ulong)local_18 * 4) != 0);
      }
      else {
        local_28 = 1;
      }
      iVar1 = local_28 + (*(uint *)(in_RDI + (ulong)local_18 * 4) >> ((byte)in_EDX & 0x1f));
      local_1c = iVar1 + local_1c;
      *(int *)(in_RDI + (ulong)local_18 * 4) = iVar1;
    }
    return local_1c;
  }
  __assert_fail("shift < 30",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x7f8f,"U32 ZSTD_downscaleStats(unsigned int *, U32, U32, base_directive_e)");
}

Assistant:

static U32
ZSTD_downscaleStats(unsigned* table, U32 lastEltIndex, U32 shift, base_directive_e base1)
{
    U32 s, sum=0;
    DEBUGLOG(5, "ZSTD_downscaleStats (nbElts=%u, shift=%u)",
            (unsigned)lastEltIndex+1, (unsigned)shift );
    assert(shift < 30);
    for (s=0; s<lastEltIndex+1; s++) {
        unsigned const base = base1 ? 1 : (table[s]>0);
        unsigned const newStat = base + (table[s] >> shift);
        sum += newStat;
        table[s] = newStat;
    }
    return sum;
}